

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libntlmconnect.c
# Opt level: O3

size_t callback(char *ptr,size_t size,size_t nmemb,void *data)

{
  undefined8 uVar1;
  int in_EAX;
  int iVar2;
  void *__dest;
  undefined8 uVar3;
  size_t __n;
  long sznum;
  long longdata;
  int local_38 [2];
  
  __n = size * nmemb;
  local_38[0] = in_EAX;
  __dest = malloc(__n + 1);
  if (__dest == (void *)0x0) {
    curl_mfprintf(_stderr,"output, malloc() failed\n");
  }
  else {
    sznum = (long)data + -0x106110 >> 3;
    memcpy(__dest,ptr,__n);
    *(undefined1 *)((long)__dest + __n) = 0;
    curl_mfprintf(_stdout,"%s",__dest);
    free(__dest);
    iVar2 = curl_easy_getinfo(easy[sznum],0x20001d,local_38);
    uVar1 = _stderr;
    if (iVar2 == 0) {
      if (local_38[0] == -1) {
        return __n;
      }
      if (sockets[sznum] == -1) {
        sockets[sznum] = local_38[0];
        return __n;
      }
      if (sockets[sznum] == local_38[0]) {
        return __n;
      }
      iVar2 = curlx_sztosi(sznum);
      curl_mfprintf(uVar1,"Handle %d started on socket %d and moved to %d\n",iVar2,sockets[sznum],
                    local_38[0]);
    }
    else {
      uVar3 = curl_easy_strerror(iVar2);
      curl_mfprintf(uVar1,"%s:%d curl_easy_getinfo() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/libntlmconnect.c"
                    ,0x42,iVar2,uVar3);
    }
  }
  res = 0x7e;
  return (ulong)(__n == 0);
}

Assistant:

static size_t callback(char* ptr, size_t size, size_t nmemb, void* data)
{
  ssize_t idx = ((CURL **) data) - easy;
  curl_socket_t sock;
  long longdata;
  CURLcode code;

  const size_t failure = (size * nmemb) ? 0 : 1;

  char *output = malloc(size * nmemb + 1);
  if(!output) {
    fprintf(stderr, "output, malloc() failed\n");
    res = TEST_ERR_MAJOR_BAD;
    return failure;
  }

  memcpy(output, ptr, size * nmemb);
  output[size * nmemb] = '\0';
  fprintf(stdout, "%s", output);
  free(output);

  /* Get socket being used for this easy handle, otherwise CURL_SOCKET_BAD */
  code = curl_easy_getinfo(easy[idx], CURLINFO_LASTSOCKET, &longdata);
  if(CURLE_OK != code) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed, "
            "with code %d (%s)\n",
            __FILE__, __LINE__, (int)code, curl_easy_strerror(code));
    res = TEST_ERR_MAJOR_BAD;
    return failure;
  }
  if(longdata == -1L)
    sock = CURL_SOCKET_BAD;
  else
    sock = (curl_socket_t)longdata;

  if(sock != CURL_SOCKET_BAD) {
    /* Track relationship between this easy handle and the socket. */
    if(sockets[idx] == CURL_SOCKET_BAD) {
      /* An easy handle without previous socket, record the socket. */
      sockets[idx] = sock;
    }
    else if(sock != sockets[idx]) {
      /* An easy handle with a socket different to previously
         tracked one, log and fail right away. Known bug #37. */
      fprintf(stderr, "Handle %d started on socket %d and moved to %d\n",
              curlx_sztosi(idx), (int)sockets[idx], (int)sock);
      res = TEST_ERR_MAJOR_BAD;
      return failure;
    }
  }
  return size * nmemb;
}